

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O2

string * __thiscall
blc::network::SSLSocket::getAddress_abi_cxx11_(string *__return_storage_ptr__,SSLSocket *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_address);
  return __return_storage_ptr__;
}

Assistant:

std::string blc::network::SSLSocket::getAddress() const {
	return (this->_address);
}